

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  double dVar1;
  Color pixel_color;
  char *pcVar2;
  array<unsigned_char,_3UL> aVar3;
  int *piVar4;
  ostream *poVar5;
  undefined8 uVar6;
  uint uVar7;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  long lVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  string scene_name;
  vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_> img_data;
  ProgressBar pb;
  ofstream outfile;
  Scene scene;
  double local_4a0;
  undefined1 *local_490;
  char *local_488;
  undefined1 local_480 [16];
  ulong local_470;
  ulong local_468;
  ulong local_460;
  undefined1 local_458 [16];
  long local_448;
  ulong local_440;
  double local_438;
  ulong local_430;
  ulong local_428;
  long local_420;
  double local_418;
  double local_410;
  double local_408;
  double local_400;
  double local_3f8;
  double local_3f0;
  double local_3e8;
  vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_> local_3e0
  ;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  double local_3b8;
  Color local_3a8;
  string local_388;
  ProgressBar local_368;
  undefined1 local_300 [16];
  _func_int *local_2f0 [29];
  ios_base local_208 [264];
  Scene local_100;
  
  local_490 = local_480;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"three_spheres","");
  pcVar2 = local_488;
  uVar9 = 0x28;
  uVar11 = 200;
  if (argc < 2) {
LAB_0010b3da:
    iVar10 = (int)uVar11;
    std::vector<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>::
    vector(&local_3e0,(ulong)(uint)(iVar10 * iVar10),(allocator_type *)local_300);
    local_388._M_dataplus._M_p = (pointer)&local_388.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_388,local_490,local_488 + (long)local_490);
    create_scene(&local_100,&local_388);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_388._M_dataplus._M_p != &local_388.field_2) {
      operator_delete(local_388._M_dataplus._M_p);
    }
    ProgressBar::ProgressBar(&local_368);
    uVar7 = (uint)((double)iVar10 / 1.7777777777777777);
    local_470 = (ulong)uVar7;
    uVar11 = uVar11 & 0xffffffff;
    local_468 = local_470;
    if (0 < (int)uVar7) {
      local_438 = (double)(int)uVar7;
      local_410 = (double)(iVar10 + -1);
      local_440 = (ulong)(uVar7 - 1);
      local_418 = (double)(int)(uVar7 - 1);
      local_448 = (long)iVar10;
      local_460 = local_470;
      local_428 = uVar9;
      do {
        lVar12 = local_440 - (local_460 - 1);
        local_430 = local_460;
        local_460 = local_460 - 1;
        ProgressBar::set_value(&local_368,((double)(int)lVar12 * 100.0) / local_438);
        if (0 < iVar10) {
          local_408 = (double)(int)local_460;
          local_420 = lVar12 * local_448 * 3;
          uVar13 = 0;
          do {
            if ((int)uVar9 < 1) {
              local_458 = ZEXT816(0);
              local_4a0 = 0.0;
            }
            else {
              local_400 = (double)(int)uVar13;
              local_458 = ZEXT816(0);
              local_4a0 = 0.0;
              do {
                if (nrand()::distribution == '\0') {
                  main_cold_1();
                }
                if (nrand()::generator == '\0') {
                  main_cold_2();
                }
                local_3e8 = std::
                            generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                      ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                        *)nrand()::generator);
                local_3f8 = DAT_00110258;
                local_3f0 = nrand()::distribution;
                if (nrand()::distribution == '\0') {
                  main_cold_3();
                }
                if (nrand()::generator == '\0') {
                  main_cold_4();
                }
                dVar1 = std::
                        generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                                  ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                                    *)nrand()::generator);
                Camera::get_ray((Ray *)local_300,&local_100.camera_,
                                (local_3e8 * (local_3f8 - local_3f0) + local_3f0 + local_400) /
                                local_410,
                                (dVar1 * (DAT_00110258 - nrand()::distribution) +
                                 nrand()::distribution + local_408) / local_418);
                trace_color(&local_3a8,(Ray *)local_300,&local_100.objects_);
                dVar1 = (double)local_458._8_8_ + local_3a8.e[1];
                local_458._8_4_ = SUB84(dVar1,0);
                local_458._0_8_ =
                     (double)local_458._0_8_ +
                     (double)CONCAT71(local_3a8.e[0]._1_7_,local_3a8.e[0]._0_1_);
                local_458._12_4_ = (int)((ulong)dVar1 >> 0x20);
                local_4a0 = local_4a0 + local_3a8.e[2];
                uVar7 = (int)uVar9 - 1;
                uVar9 = (ulong)uVar7;
              } while (uVar7 != 0);
            }
            uVar9 = local_428;
            local_3c8 = local_458._0_8_;
            uStack_3c0 = local_458._8_8_;
            local_3b8 = local_4a0;
            pixel_color.e[2] = local_4a0;
            pixel_color.e[0] = (double)local_458._0_8_;
            pixel_color.e[1] = (double)local_458._8_8_;
            aVar3 = gen_color(pixel_color,(int)local_428);
            local_3e0.
            super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_elems[local_420 + 2] =
                 aVar3._M_elems[2];
            *(short *)(local_3e0.
                       super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar13]._M_elems + local_420) =
                 aVar3._M_elems._0_2_;
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar11);
        }
      } while (1 < (long)local_430);
    }
    std::ofstream::ofstream(local_300);
    std::ofstream::open(local_300,0x10c540);
    uVar9 = local_470;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,"P6\n",3);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)local_300,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,(int)uVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xff);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    std::ofstream::close();
    std::ofstream::open(local_300,0x10c540);
    if (0 < (int)uVar9) {
      lVar12 = 0;
      uVar9 = 0;
      do {
        lVar8 = lVar12;
        uVar13 = uVar11;
        if (0 < iVar10) {
          do {
            aVar3._M_elems[2] =
                 (local_3e0.
                  super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar8 + 2];
            aVar3._M_elems._0_2_ =
                 *(undefined2 *)
                  ((local_3e0.
                    super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_elems + lVar8);
            write_color((ofstream *)local_300,aVar3);
            lVar8 = lVar8 + 3;
            uVar13 = uVar13 - 1;
          } while (uVar13 != 0);
        }
        uVar9 = uVar9 + 1;
        lVar12 = lVar12 + uVar11 * 3;
      } while (uVar9 != local_468);
    }
    local_3a8.e[0]._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_300,(char *)&local_3a8,1);
    std::ofstream::close();
    local_300._0_8_ = _VTT;
    *(undefined8 *)(local_300 + *(long *)((long)_VTT + -0x18)) = _memcpy;
    std::filebuf::~filebuf((filebuf *)(local_300 + 8));
    std::ios_base::~ios_base(local_208);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368.bar._M_dataplus._M_p != &local_368.bar.field_2) {
      operator_delete(local_368.bar._M_dataplus._M_p);
    }
    local_100.objects_.super_Object._vptr_Object = (_func_int **)&PTR_hit_0010fb28;
    std::vector<std::shared_ptr<Object>,_std::allocator<std::shared_ptr<Object>_>_>::~vector
              (&local_100.objects_.objects_);
    if (local_3e0.
        super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3e0.
                      super__Vector_base<std::array<unsigned_char,_3UL>,_std::allocator<std::array<unsigned_char,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_490 != local_480) {
      operator_delete(local_490);
    }
    return 0;
  }
  __s = argv[1];
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&local_490,0,pcVar2,(ulong)__s);
  if (argc == 2) {
    uVar11 = 200;
    uVar9 = 0x28;
    goto LAB_0010b3da;
  }
  std::__cxx11::string::string((string *)local_300,argv[2],(allocator *)&local_368);
  uVar6 = local_300._0_8_;
  piVar4 = __errno_location();
  iVar10 = *piVar4;
  *piVar4 = 0;
  uVar11 = strtol((char *)uVar6,(char **)&local_100,10);
  if (local_100.objects_.super_Object._vptr_Object == (_func_int **)uVar6) {
    std::__throw_invalid_argument("stoi");
LAB_0010b9ad:
    std::__throw_out_of_range("stoi");
  }
  else {
    if (((long)(int)uVar11 != uVar11) || (*piVar4 == 0x22)) goto LAB_0010b9ad;
    uVar9 = 0x28;
    if (*piVar4 == 0) {
      *piVar4 = iVar10;
    }
    if ((_func_int **)local_300._0_8_ != local_2f0) {
      operator_delete((void *)local_300._0_8_);
    }
    if ((uint)argc < 4) goto LAB_0010b3da;
    std::__cxx11::string::string((string *)local_300,argv[3],(allocator *)&local_368);
    uVar6 = local_300._0_8_;
    iVar10 = *piVar4;
    *piVar4 = 0;
    uVar9 = strtol((char *)local_300._0_8_,(char **)&local_100,10);
    if (local_100.objects_.super_Object._vptr_Object != (_func_int **)uVar6) {
      if ((0xfffffffeffffffff < uVar9 - 0x80000000) && (*piVar4 != 0x22)) {
        if (*piVar4 == 0) {
          *piVar4 = iVar10;
        }
        if ((_func_int **)local_300._0_8_ != local_2f0) {
          operator_delete((void *)local_300._0_8_);
        }
        goto LAB_0010b3da;
      }
      goto LAB_0010b9c5;
    }
  }
  std::__throw_invalid_argument("stoi");
LAB_0010b9c5:
  uVar6 = std::__throw_out_of_range("stoi");
  if (local_490 != local_480) {
    operator_delete(local_490);
  }
  _Unwind_Resume(uVar6);
}

Assistant:

int main(int argc, char** argv) {

  // options
  std::string scene_name = "three_spheres";

  if (argc > 1) {
    scene_name = argv[1];
  }

  int image_width = 200;


  if (argc > 2) {
    image_width = std::stoi(argv[2]);
  }

  int samples_per_pixel = 40;

  if (argc > 3) {
    samples_per_pixel = std::stoi(argv[3]);
  }

  const int image_height = static_cast<int>(image_width / ASPECT_RATIO);

  std::vector<std::array<uint8_t, 3>> img_data(image_width*image_width);

  // image generation
  Scene scene = create_scene(scene_name);
  ProgressBar pb{};

  for (int j = image_height - 1; j >= 0; --j) {
    pb.set_value(100.0 * (image_height - 1 - j) / (double)image_height);
    #pragma omp parallel for shared(img_data, scene) schedule(dynamic)
    for (int i = 0; i < image_width; ++i) {
      Color pixel_color{0.0, 0.0, 0.0};
      for (int s = 0; s < samples_per_pixel; ++s) {
        double u = (i + nrand()) / (image_width - 1);
        double v = (j + nrand()) / (image_height - 1);
        Ray r = scene.camera().get_ray(u, v);
        pixel_color += trace_color(r, scene.objects());
      }
      img_data[(image_height - 1 - j) * image_width + i] = gen_color(pixel_color, samples_per_pixel);
    }
  }

  // write image file
  std::ofstream outfile;
  outfile.open("image.ppm");

  // write ppm header
  outfile << "P6\n" << image_width << " " << image_height << "\n" << IRGB_MAX << "\n";
  outfile.close();

  outfile.open("image.ppm", std::ios::binary | std::ios::app);

  for (int j = 0; j <= image_height - 1; ++j) {
    for (int i = 0; i < image_width; ++i) {
      write_color(outfile, img_data[j * image_width + i]);
    }
  }
  outfile << '\n';
  outfile.close();


  // used to clean up openmc memory if needed
  teardown();

  return 0;
}